

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_build_lights.cxx
# Opt level: O0

void __thiscall
xray_re::xr_build_lights::read_lights
          (xr_build_lights *this,xr_reader *r,uint32_t id,r_light_vec *lights,bool cs)

{
  uint16_t uVar1;
  size_t sVar2;
  uint uVar3;
  float fVar4;
  uint32_t local_54;
  long local_50;
  uint_fast32_t i;
  r_light *light;
  size_t n;
  xr_reader *s;
  r_light_vec *prStack_28;
  bool cs_local;
  r_light_vec *lights_local;
  xr_reader *pxStack_18;
  uint32_t id_local;
  xr_reader *r_local;
  xr_build_lights *this_local;
  
  s._7_1_ = cs;
  prStack_28 = lights;
  lights_local._4_4_ = id;
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  n = (size_t)xr_reader::open_chunk(r,id);
  if ((xr_reader *)n != (xr_reader *)0x0) {
    sVar2 = xr_reader::size((xr_reader *)n);
    uVar3 = 100;
    if ((s._7_1_ & 1) != 0) {
      uVar3 = 0x68;
    }
    light = (r_light *)(sVar2 / uVar3);
    std::vector<xray_re::r_light_*,_std::allocator<xray_re::r_light_*>_>::reserve
              (prStack_28,(size_type)light);
    for (; light != (r_light *)0x0; light = (r_light *)((long)&light[-1].unknown + 3)) {
      i = (uint_fast32_t)operator_new(0x68);
      std::vector<xray_re::r_light_*,_std::allocator<xray_re::r_light_*>_>::push_back
                (prStack_28,(value_type *)&i);
      uVar1 = xr_reader::r_u16((xr_reader *)n);
      *(uint16_t *)i = uVar1;
      uVar1 = xr_reader::r_u16((xr_reader *)n);
      *(uint16_t *)(i + 2) = uVar1;
      xr_reader::r_fvector3((xr_reader *)n,(fvector3 *)(i + 4));
      xr_reader::r_fvector3((xr_reader *)n,(fvector3 *)(i + 0x10));
      xr_reader::r_fvector3((xr_reader *)n,(fvector3 *)(i + 0x1c));
      fVar4 = xr_reader::r_float((xr_reader *)n);
      *(float *)(i + 0x28) = fVar4;
      fVar4 = xr_reader::r_float((xr_reader *)n);
      *(float *)(i + 0x2c) = fVar4;
      fVar4 = xr_reader::r_float((xr_reader *)n);
      *(float *)(i + 0x30) = fVar4;
      fVar4 = xr_reader::r_float((xr_reader *)n);
      *(float *)(i + 0x34) = fVar4;
      fVar4 = xr_reader::r_float((xr_reader *)n);
      *(float *)(i + 0x38) = fVar4;
      fVar4 = xr_reader::r_float((xr_reader *)n);
      *(float *)(i + 0x3c) = fVar4;
      for (local_50 = 0; local_50 != 3; local_50 = local_50 + 1) {
        xr_reader::r_fvector3((xr_reader *)n,(fvector3 *)(i + 0x40 + local_50 * 0xc));
      }
      if ((s._7_1_ & 1) == 0) {
        local_54 = 0;
      }
      else {
        local_54 = xr_reader::r_u32((xr_reader *)n);
      }
      *(uint32_t *)(i + 100) = local_54;
    }
    xr_reader::close_chunk(pxStack_18,(xr_reader **)&n);
  }
  return;
}

Assistant:

void xr_build_lights::read_lights(xr_reader& r, uint32_t id, r_light_vec& lights, bool cs)
{
	if (xr_reader* s = r.open_chunk(id)) {
		size_t n = s->size() / (cs ? R_LIGHT_SIZE_CS : R_LIGHT_SIZE_SOC);
		lights.reserve(n);
		for (; n > 0; --n) {
			r_light* light = new r_light;
			lights.push_back(light);
			light->type = s->r_u16();
			light->level = s->r_u16();
			s->r_fvector3(light->diffuse);
			s->r_fvector3(light->position);
			s->r_fvector3(light->direction);
			light->range = s->r_float();
			light->range2 = s->r_float();
			light->attenuation0 = s->r_float();
			light->attenuation1 = s->r_float();
			light->attenuation2 = s->r_float();
			light->energy = s->r_float();
			for (uint_fast32_t i = 0; i != 3; ++i)
				s->r_fvector3(light->tri[i]);
			light->unknown = cs ? s->r_u32() : 0;
		}
		r.close_chunk(s);
	}
}